

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_GRANITE(effect_handler_context_t_conflict *context)

{
  trap *ptVar1;
  chunk_conflict *c;
  _Bool daytime;
  trap *trap;
  effect_handler_context_t_conflict *context_local;
  
  ptVar1 = (context->origin).which.trap;
  square_set_feat((chunk *)cave,ptVar1->grid,L'\x15');
  c = cave;
  if (cave->depth == 0) {
    daytime = is_daytime();
    expose_to_sun((chunk *)c,(loc)ptVar1->grid,daytime);
  }
  player->upkeep->update = player->upkeep->update | 0x60;
  player->upkeep->redraw = player->upkeep->redraw | 0xc00000;
  return true;
}

Assistant:

bool effect_handler_GRANITE(effect_handler_context_t *context)
{
	struct trap *trap = context->origin.which.trap;
	square_set_feat(cave, trap->grid, FEAT_GRANITE);
	if (cave->depth == 0) expose_to_sun(cave, trap->grid, is_daytime());

	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
	player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);

	return true;
}